

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall
wasm::LazyLocalGraph::LazyLocalGraph
          (LazyLocalGraph *this,Function *func,Module *module,
          optional<wasm::Expression::Id> queryClass)

{
  Module *module_local;
  Function *func_local;
  LazyLocalGraph *this_local;
  optional<wasm::Expression::Id> queryClass_local;
  
  LocalGraphBase::LocalGraphBase(&this->super_LocalGraphBase,func,module);
  (this->queryClass).super__Optional_base<wasm::Expression::Id,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Expression::Id> =
       (_Optional_payload_base<wasm::Expression::Id>)
       queryClass.super__Optional_base<wasm::Expression::Id,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Expression::Id>;
  std::
  unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
  ::unordered_map(&this->getSetsMap);
  std::
  unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
  ::unordered_map(&this->setInfluences);
  std::
  optional<std::unordered_map<wasm::LocalGet_*,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>_>_>
  ::optional(&this->getInfluences);
  std::
  unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::unordered_map(&this->SSAIndexes);
  std::
  optional<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
  ::optional(&this->locations);
  std::unique_ptr<wasm::LocalGraphFlower,std::default_delete<wasm::LocalGraphFlower>>::
  unique_ptr<std::default_delete<wasm::LocalGraphFlower>,void>
            ((unique_ptr<wasm::LocalGraphFlower,std::default_delete<wasm::LocalGraphFlower>> *)
             &this->flower);
  return;
}

Assistant:

LazyLocalGraph::LazyLocalGraph(Function* func,
                               Module* module,
                               std::optional<Expression::Id> queryClass)
  : LocalGraphBase(func, module), queryClass(queryClass) {}